

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O2

Transform * __thiscall
iDynTree::Axis::getTranslationTransform(Transform *__return_storage_ptr__,Axis *this,double dist)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Position translationPosition;
  Rotation local_68;
  
  Transform::Transform(__return_storage_ptr__);
  Rotation::Identity();
  Transform::setRotation(__return_storage_ptr__,&local_68);
  dVar1 = (this->direction).super_Vector3.m_data[2];
  dVar3 = (this->direction).super_Vector3.m_data[0];
  dVar2 = (this->direction).super_Vector3.m_data[1];
  Position::Position((Position *)&local_68);
  dVar2 = dist * dVar2;
  local_68.super_Matrix3x3.m_data[1]._0_4_ = SUB84(dVar2,0);
  local_68.super_Matrix3x3.m_data[0] = dist * dVar3;
  local_68.super_Matrix3x3.m_data[1]._4_4_ = (int)((ulong)dVar2 >> 0x20);
  local_68.super_Matrix3x3.m_data[2] = dVar1 * dist;
  Transform::setPosition(__return_storage_ptr__,(Position *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Transform Axis::getTranslationTransform(const double dist) const
    {
        Transform nonTranslated_T_translated;

        //No rotation
        nonTranslated_T_translated.setRotation(iDynTree::Rotation::Identity());

        // translation
        double u   = this->getDirection()(0);
        double v   = this->getDirection()(1);
        double w   = this->getDirection()(2);
       
        Position translationPosition;
            
        //Translation because of joint variable    
        translationPosition(0) = u*dist;
        translationPosition(1) = v*dist;
        translationPosition(2) = w*dist;

        nonTranslated_T_translated.setPosition(translationPosition);

        return nonTranslated_T_translated;
    }